

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O0

QString * __thiscall ICOReader::iconAt(ICOReader *this,int index)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  byte bVar2;
  T TVar3;
  int iVar4;
  T TVar5;
  Format FVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  int in_EDX;
  Format *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  Format format;
  bool isPngImage;
  QImage *image;
  QImage mask;
  QSize size;
  QImage image_1;
  BMP_INFOHDR header;
  QByteArray pngMagic;
  ICONDIRENTRY iconEntry;
  QImage img;
  int in_stack_fffffffffffffdf8;
  ImageConversionFlag in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  quint32 in_stack_fffffffffffffe04;
  Format in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  Format f;
  QLatin1String *in_stack_fffffffffffffe10;
  QLatin1String *this_00;
  ICOReader *in_stack_fffffffffffffe18;
  long *plVar10;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  undefined7 in_stack_fffffffffffffe30;
  Format local_1a0;
  undefined1 local_180 [40];
  undefined1 local_158 [24];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  QImage local_120 [24];
  QSize *local_108;
  QSize *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [14];
  QLatin1String QStack_d2;
  undefined1 local_b8 [40];
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  QByteArray local_48;
  undefined1 local_30 [8];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_20);
  iVar4 = count((ICOReader *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (in_EDX < iVar4) {
    local_30 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    bVar1 = readIconEntry((ICOReader *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                          ,in_stack_fffffffffffffe04,
                          (ICONDIRENTRY *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (bVar1) {
      plVar10 = *(long **)(in_RSI + 6);
      TVar5 = QSpecialInteger::operator_cast_to_unsigned_int
                        ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)0x105e0e);
      uVar7 = (**(code **)(*plVar10 + 0x88))(plVar10,TVar5);
      if ((uVar7 & 1) != 0) {
        TVar5 = QSpecialInteger::operator_cast_to_unsigned_int
                          ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)0x105e37);
        pcVar9 = (char *)(ulong)TVar5;
        lVar8 = (**(code **)(**(long **)(in_RSI + 6) + 0xa0))();
        if ((long)pcVar9 <= lVar8) {
          local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          local_48.d.size = -0x5555555555555556;
          QByteArray::fromRawData
                    ((char *)in_stack_fffffffffffffe18,(qsizetype)in_stack_fffffffffffffe10);
          flags.i = (Int)((ulong)*(undefined8 *)(in_RSI + 6) >> 0x20);
          QByteArray::size(&local_48);
          QIODevice::read((longlong)local_60);
          bVar2 = operator==((QByteArray *)in_stack_fffffffffffffe10,
                             (QByteArray *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          QByteArray::~QByteArray((QByteArray *)0x105f1a);
          if ((bVar2 & 1) == 0) {
            memset(local_e0,0xaa,0x28);
            QSpecialInteger::operator_cast_to_unsigned_int
                      ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)0x1060bb);
            bVar1 = readBMPHeader((ICOReader *)
                                  CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                                  in_stack_fffffffffffffe04,
                                  (BMP_INFOHDR *)
                                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
            if (bVar1) {
              TVar3 = QSpecialInteger::operator_cast_to_unsigned_short
                                ((QSpecialInteger<QLittleEndianStorageType<unsigned_short>_> *)
                                 0x1060e9);
              if (TVar3 == 0) {
                this_00 = (QLatin1String *)(local_30 + 6);
              }
              else {
                this_00 = &QStack_d2;
              }
              TVar3 = QSpecialInteger::operator_cast_to_unsigned_short
                                ((QSpecialInteger<QLittleEndianStorageType<unsigned_short>_> *)
                                 0x10611d);
              *in_RSI = (uint)TVar3;
              f = *in_RSI;
              if (f == Format_Mono) {
                in_RSI[4] = Format_Mono;
              }
              else if ((f == Format_RGB32) || (f == Format_ARGB8565_Premultiplied)) {
                in_RSI[4] = Format_ARGB8565_Premultiplied;
              }
              else {
                if (((f != Format_RGBX8888) && (f != Format_Grayscale8)) &&
                   (f != Format_RGBA16FPx4_Premultiplied)) {
                  QImage::QImage((QImage *)
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                 (QImage *)
                                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
                  bVar1 = true;
                  goto LAB_00106650;
                }
                in_RSI[4] = Format_RGBA16FPx4_Premultiplied;
              }
              if (in_RSI[4] == Format_RGBA16FPx4_Premultiplied) {
                in_RSI[1] = Format_Invalid;
              }
              else {
                TVar5 = QSpecialInteger::operator_cast_to_unsigned_int
                                  ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)
                                   0x1061e1);
                if (TVar5 == 0) {
                  in_stack_fffffffffffffe08 = 1 << ((byte)*in_RSI & 0x1f);
                }
                else {
                  in_stack_fffffffffffffe08 =
                       QSpecialInteger::operator_cast_to_unsigned_int
                                 ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)
                                  0x1061f7);
                }
                in_RSI[1] = in_stack_fffffffffffffe08;
              }
              if ((int)in_RSI[1] < 0x101) {
                in_RSI[3] = (uint)local_30[0];
                if (in_RSI[3] == Format_Invalid) {
                  FVar6 = QSpecialInteger::operator_cast_to_unsigned_int
                                    ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)
                                     0x10626f);
                  in_RSI[3] = FVar6;
                }
                in_RSI[2] = (uint)local_30[1];
                if (in_RSI[2] == Format_Invalid) {
                  TVar5 = QSpecialInteger::operator_cast_to_unsigned_int
                                    ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)
                                     0x1062a0);
                  in_RSI[2] = TVar5 >> 1;
                }
                if (((int)in_RSI[3] < 0x101) && ((int)in_RSI[2] < 0x101)) {
                  local_1a0 = Format_ARGB32;
                  if (*in_RSI == Format_Grayscale8) {
                    local_1a0 = Format_RGB32;
                  }
                  else if ((in_RSI[1] == Format_MonoLSB) && (in_RSI[4] == Format_Mono)) {
                    local_1a0 = Format_Mono;
                  }
                  else if (0 < (int)in_RSI[1]) {
                    local_1a0 = Format_Indexed8;
                  }
                  local_f8 = 0xaaaaaaaaaaaaaaaa;
                  local_f0 = 0xaaaaaaaaaaaaaaaa;
                  local_e8 = 0xaaaaaaaaaaaaaaaa;
                  QImage::QImage((QImage *)&local_f8);
                  local_100 = (QSize *)0xaaaaaaaaaaaaaaaa;
                  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00
                                                ),in_stack_fffffffffffffdfc,
                               in_stack_fffffffffffffdf8);
                  local_108 = local_100;
                  uVar7 = QImageIOHandler::allocateImage(local_100,local_1a0,(QImage *)&local_f8);
                  if ((uVar7 & 1) != 0) {
                    findColorInfo((ICOReader *)
                                  CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                  (QImage *)
                                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
                    uVar7 = QImage::isNull();
                    if ((uVar7 & 1) == 0) {
                      readBMP((ICOReader *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              (QImage *)
                              CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
                      uVar7 = QImage::isNull();
                      if ((uVar7 & 1) == 0) {
                        if (*in_RSI == Format_RGBA16FPx4_Premultiplied) {
                          QFlags<Qt::ImageConversionFlag>::QFlags
                                    ((QFlags<Qt::ImageConversionFlag> *)
                                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                     in_stack_fffffffffffffdfc);
                          QImage::convertToFormat((QImage *)this_00,f,(ImageConversionFlags)flags.i)
                          ;
                          QImage::operator=((QImage *)CONCAT44(f,in_stack_fffffffffffffe08),
                                            (QImage *)
                                            CONCAT44(in_stack_fffffffffffffe04,
                                                     in_stack_fffffffffffffe00));
                          QImage::~QImage(local_120);
                        }
                        else {
                          local_140 = 0xaaaaaaaaaaaaaaaa;
                          local_138 = 0xaaaaaaaaaaaaaaaa;
                          local_130 = 0xaaaaaaaaaaaaaaaa;
                          in_stack_fffffffffffffe04 = QImage::width();
                          iVar4 = QImage::height();
                          QImage::QImage((QImage *)&local_140,in_stack_fffffffffffffe04,iVar4,
                                         Format_Mono);
                          uVar7 = QImage::isNull();
                          if ((uVar7 & 1) == 0) {
                            QImage::setColorCount((int)&local_140);
                            qRgba(0xff,0xff,0xff,0xff);
                            QImage::setColor((int)&local_140,0);
                            qRgba(0,0,0,0xff);
                            QImage::setColor((int)&local_140,1);
                            read1BitBMP(in_stack_fffffffffffffe18,(QImage *)this_00);
                            uVar7 = QImage::isNull();
                            if ((uVar7 & 1) == 0) {
                              QImage::operator=((QImage *)&local_20,(QImage *)&local_f8);
                              QImage::setAlphaChannel((QImage *)&local_20);
                            }
                          }
                          QImage::~QImage((QImage *)&local_140);
                        }
                      }
                    }
                  }
                  QLatin1String::QLatin1String
                            (this_00,(char *)CONCAT44(f,in_stack_fffffffffffffe08));
                  latin1_00.m_size._7_1_ = bVar2;
                  latin1_00.m_size._0_7_ = in_stack_fffffffffffffe30;
                  latin1_00.m_data = pcVar9;
                  QString::QString((QString *)this_00,latin1_00);
                  TVar3 = QSpecialInteger::operator_cast_to_unsigned_short
                                    ((QSpecialInteger<QLittleEndianStorageType<unsigned_short>_> *)
                                     0x1065ef);
                  QString::number((int)local_180,(uint)TVar3);
                  QImage::setText((QString *)&local_20,(QString *)local_158);
                  QString::~QString((QString *)0x10662e);
                  QString::~QString((QString *)0x10663b);
                  QImage::~QImage((QImage *)&local_f8);
                  goto LAB_00106648;
                }
                QImage::QImage((QImage *)
                               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                               (QImage *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
                bVar1 = true;
              }
              else {
                QImage::QImage((QImage *)
                               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                               (QImage *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
                bVar1 = true;
              }
            }
            else {
LAB_00106648:
              bVar1 = false;
            }
          }
          else {
            plVar10 = *(long **)(in_RSI + 6);
            TVar5 = QSpecialInteger::operator_cast_to_unsigned_int
                              ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)0x105f4e)
            ;
            (**(code **)(*plVar10 + 0x88))(plVar10,TVar5);
            *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
            *(undefined8 *)(in_RDI + 8) = 0xaaaaaaaaaaaaaaaa;
            *(undefined8 *)(in_RDI + 0x10) = 0xaaaaaaaaaaaaaaaa;
            QSpecialInteger::operator_cast_to_unsigned_int
                      ((QSpecialInteger<QLittleEndianStorageType<unsigned_int>_> *)0x105fa9);
            QIODevice::read((longlong)local_78);
            QImage::fromData((QByteArray *)in_stack_fffffffffffffe10,
                             (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            QByteArray::~QByteArray((QByteArray *)0x105fe5);
            QLatin1String::QLatin1String
                      (in_stack_fffffffffffffe10,
                       (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            latin1.m_size._7_1_ = bVar2;
            latin1.m_size._0_7_ = in_stack_fffffffffffffe30;
            latin1.m_data = pcVar9;
            QString::QString((QString *)in_stack_fffffffffffffe10,latin1);
            TVar3 = QSpecialInteger::operator_cast_to_unsigned_short
                              ((QSpecialInteger<QLittleEndianStorageType<unsigned_short>_> *)
                               0x106027);
            QString::number((int)local_b8,(uint)TVar3);
            QImage::setText(in_RDI,(QString *)local_90);
            QString::~QString((QString *)0x106063);
            QString::~QString((QString *)0x106070);
            bVar1 = true;
          }
LAB_00106650:
          QByteArray::~QByteArray((QByteArray *)0x10665d);
          if (bVar1) goto LAB_00106685;
          goto LAB_0010666b;
        }
      }
      QImage::QImage((QImage *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (QImage *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      goto LAB_00106685;
    }
  }
LAB_0010666b:
  QImage::QImage((QImage *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (QImage *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
LAB_00106685:
  QImage::~QImage((QImage *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QImage ICOReader::iconAt(int index)
{
    QImage img;

    if (count() > index) { // forces header to be read

        ICONDIRENTRY iconEntry;
        if (readIconEntry(index, &iconEntry)) {

            static const uchar pngMagicData[] = { 137, 80, 78, 71, 13, 10, 26, 10 };

            if (!iod->seek(iconEntry.dwImageOffset)
                || iconEntry.dwBytesInRes > iod->bytesAvailable())
                return img;

            const QByteArray pngMagic = QByteArray::fromRawData((const char*)pngMagicData, sizeof(pngMagicData));
            const bool isPngImage = (iod->read(pngMagic.size()) == pngMagic);

            if (isPngImage) {
                iod->seek(iconEntry.dwImageOffset);
                QImage image = QImage::fromData(iod->read(iconEntry.dwBytesInRes), "png");
                image.setText(QLatin1String(icoOrigDepthKey), QString::number(iconEntry.wBitCount));
                return image;
            }

            BMP_INFOHDR header;
            if (readBMPHeader(iconEntry.dwImageOffset, &header)) {
                icoAttrib.nbits = header.biBitCount ? header.biBitCount : iconEntry.wBitCount;

                switch (icoAttrib.nbits) {
                case 32:
                case 24:
                case 16:
                    icoAttrib.depth = 32;
                    break;
                case 8:
                case 4:
                    icoAttrib.depth = 8;
                    break;
                case 1:
                    icoAttrib.depth = 1;
                    break;
                default:
                    return img;
                    break;
                }
                if (icoAttrib.depth == 32)                // there's no colormap
                    icoAttrib.ncolors = 0;
                else                    // # colors used
                    icoAttrib.ncolors = header.biClrUsed ? uint(header.biClrUsed) : 1 << icoAttrib.nbits;
                if (icoAttrib.ncolors > 256) //color table can't be more than 256
                    return img;
                icoAttrib.w = iconEntry.bWidth;
                if (icoAttrib.w == 0) // means 256 pixels
                    icoAttrib.w = header.biWidth;
                icoAttrib.h = iconEntry.bHeight;
                if (icoAttrib.h == 0) // means 256 pixels
                    icoAttrib.h = header.biHeight/2;
                if (icoAttrib.w > 256 || icoAttrib.h > 256) // Max ico size
                    return img;

                QImage::Format format = QImage::Format_ARGB32;
                if (icoAttrib.nbits == 24)
                    format = QImage::Format_RGB32;
                else if (icoAttrib.ncolors == 2 && icoAttrib.depth == 1)
                    format = QImage::Format_Mono;
                else if (icoAttrib.ncolors > 0)
                    format = QImage::Format_Indexed8;

                QImage image;
                const QSize size(icoAttrib.w, icoAttrib.h);
                if (QImageIOHandler::allocateImage(size, format, &image)) {
                    findColorInfo(image);
                    if (!image.isNull()) {
                        readBMP(image);
                        if (!image.isNull()) {
                            if (icoAttrib.nbits == 32) {
                                img = std::move(image).convertToFormat(QImage::Format_ARGB32_Premultiplied);
                            } else {
                                QImage mask(image.width(), image.height(), QImage::Format_Mono);
                                if (!mask.isNull()) {
                                    mask.setColorCount(2);
                                    mask.setColor(0, qRgba(255,255,255,0xff));
                                    mask.setColor(1, qRgba(0  ,0  ,0  ,0xff));
                                    read1BitBMP(mask);
                                    if (!mask.isNull()) {
                                        img = image;
                                        img.setAlphaChannel(mask);
                                    }
                                }
                            }
                        }
                    }
                }
                img.setText(QLatin1String(icoOrigDepthKey), QString::number(iconEntry.wBitCount));
            }
        }
    }

    return img;
}